

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_buffers.cpp
# Opt level: O0

vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_>
* polyscope::render::
  getAttributeBufferDataRange<std::array<glm::vec<3,float,(glm::qualifier)0>,4ul>>
            (AttributeBuffer *buff,size_t ind,size_t count)

{
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar1;
  reference __n;
  reference pvVar2;
  allocator_type *in_RCX;
  long in_RDX;
  long *in_RSI;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL> *in_RDI;
  size_t j;
  size_t i;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  fetch;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_>
  *out;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL> *this;
  allocator_type *__a;
  undefined1 *__n_00;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_>
  *in_stack_ffffffffffffffa0;
  ulong uVar3;
  allocator_type *local_58;
  undefined1 local_3a;
  undefined1 local_39;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_38;
  allocator_type *local_20;
  
  this = in_RDI;
  local_20 = in_RCX;
  (**(code **)(*in_RSI + 0xe8))(&local_38,in_RSI,in_RDX << 2,(long)in_RCX << 2);
  local_39 = 0;
  __n_00 = &local_3a;
  __a = local_20;
  std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>::allocator
            ((allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_> *)0x44e5a1);
  std::
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_>
  ::vector(in_stack_ffffffffffffffa0,(size_type)__n_00,__a);
  std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>::~allocator
            ((allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_> *)0x44e5c1);
  for (local_58 = (allocator_type *)0x0; local_58 < local_20; local_58 = local_58 + 1) {
    for (uVar3 = 0; uVar3 < 4; uVar3 = uVar3 + 1) {
      __n = std::
            vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ::operator[](&local_38,(long)local_58 * 4 + uVar3);
      std::
      vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_>
      ::operator[]((vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_>
                    *)in_RDI,(size_type)local_58);
      pvVar2 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>::operator[]
                         (this,(size_type)__n);
      aVar1 = __n->field_1;
      pvVar2->field_0 = __n->field_0;
      pvVar2->field_1 = aVar1;
      pvVar2->field_2 = __n->field_2;
    }
  }
  local_39 = 1;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)__a);
  return (vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_>
          *)this;
}

Assistant:

std::vector<std::array<glm::vec3, 4>> getAttributeBufferDataRange<std::array<glm::vec3, 4>>(AttributeBuffer& buff,
                                                                                            size_t ind, size_t count) {
  std::vector<glm::vec3> fetch = buff.getDataRange_vec3(4 * ind, 4 * count);
  std::vector<std::array<glm::vec3, 4>> out(count);
  for (size_t i = 0; i < count; i++) {
    for (size_t j = 0; j < 4; j++) {
      out[i][j] = fetch[4 * i + j];
    }
  }
  return out;
}